

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLT.h
# Opt level: O1

Index Eigen::internal::llt_inplace<double,1>::
      unblocked<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *mat)

{
  ResScalar *res;
  PointerType pdVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  char *__function;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong cols;
  Index size;
  ulong uVar14;
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double __x;
  double *pdVar18;
  const_blas_data_mapper<double,_long,_0> local_a8;
  const_blas_data_mapper<double,_long,_1> local_98;
  ulong local_88;
  ulong local_80;
  double *local_78;
  long local_68;
  long local_60;
  double local_58;
  ulong local_50;
  long local_48;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *local_40;
  long local_38;
  
  uVar7 = (mat->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_rows.m_value;
  local_40 = mat;
  if (uVar7 != (mat->
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
               .m_cols.m_value) {
    __assert_fail("mat.rows()==mat.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Cholesky/LLT.h"
                  ,0x136,
                  "static Index Eigen::internal::llt_inplace<double, 1>::unblocked(MatrixType &) [Scalar = double, UpLo = 1, MatrixType = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                 );
  }
  lVar12 = 0;
  uVar13 = 0;
  if (0 < (long)uVar7) {
    uVar13 = uVar7;
  }
  lVar8 = 8;
  lVar9 = -1;
  cols = 0;
  uVar11 = uVar7;
  local_88 = uVar7;
  local_80 = uVar13;
  while( true ) {
    if (cols == uVar13) {
      return 0xffffffffffffffff;
    }
    pdVar1 = (local_40->
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
             .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_data;
    uVar14 = ~cols + uVar11;
    if ((long)uVar14 < 0 && pdVar1 != (PointerType)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, Level = 0]"
                   );
    }
    if ((((long)uVar14 < 0) ||
        (lVar15 = (local_40->
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value, (long)(lVar15 - uVar14) <= (long)cols)) ||
       ((local_40->
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_cols.m_value <= (long)cols)) break;
    if (lVar15 <= (long)cols) {
      __function = 
      "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
      ;
      goto LAB_001136bb;
    }
    local_38 = (local_40->
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               m_outerStride;
    lVar15 = local_38 * cols;
    pdVar18 = pdVar1 + cols;
    __x = pdVar1[lVar15 + cols];
    if (cols != 0) {
      dVar16 = *pdVar18 * *pdVar18;
      if (cols != 1) {
        pdVar4 = (double *)(lVar12 + local_38 * 8 + (long)pdVar1);
        lVar5 = lVar9;
        do {
          dVar16 = dVar16 + *pdVar4 * *pdVar4;
          pdVar4 = pdVar4 + local_38;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      __x = __x - dVar16;
    }
    uVar3 = cols;
    if (0.0 < __x) {
      local_78 = pdVar18;
      local_68 = lVar12;
      local_60 = lVar8;
      local_58 = __x;
      local_48 = lVar9;
      if (__x < 0.0) {
        pdVar18 = (double *)sqrt(__x);
      }
      else {
        pdVar18 = (double *)SQRT(__x);
      }
      res = pdVar1 + cols + 1 + lVar15;
      (local_40->
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
      [(local_40->
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       m_outerStride * cols + cols] = (double)pdVar18;
      if (uVar14 != 0 && cols != 0) {
        local_a8.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride = local_38;
        local_98.super_blas_data_mapper<const_double,_long,_1,_0>.m_data = local_78;
        local_98.super_blas_data_mapper<const_double,_long,_1,_0>.m_stride = local_38;
        local_a8.super_blas_data_mapper<const_double,_long,_0,_0>.m_data = pdVar1 + cols + 1;
        local_78 = pdVar18;
        general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
        ::run(uVar14,cols,&local_a8,&local_98,res,1,-1.0);
        pdVar18 = local_78;
      }
      uVar3 = local_50;
      lVar8 = local_60;
      lVar9 = local_48;
      uVar11 = local_88;
      lVar12 = local_68;
      uVar13 = local_80;
      __x = local_58;
      if (uVar14 != 0) {
        uVar2 = uVar14;
        if ((((ulong)res & 7) == 0) &&
           (uVar2 = (ulong)((uint)((ulong)res >> 3) & 1), (long)uVar14 <= (long)uVar2)) {
          uVar2 = uVar14;
        }
        if (0 < (long)uVar2) {
          lVar15 = local_38 * local_68 + local_60;
          uVar6 = 0;
          do {
            *(double *)((long)pdVar1 + uVar6 * 8 + lVar15) =
                 *(double *)((long)pdVar1 + uVar6 * 8 + lVar15) / (double)pdVar18;
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        lVar5 = uVar14 - uVar2;
        uVar6 = lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffe;
        lVar15 = uVar6 + uVar2;
        if (1 < lVar5) {
          lVar5 = (local_38 + 1) * local_68;
          uVar10 = uVar2;
          do {
            auVar17._8_8_ = pdVar18;
            auVar17._0_8_ = pdVar18;
            auVar17 = divpd(*(undefined1 (*) [16])((long)pdVar1 + uVar10 * 8 + lVar5 + 8),auVar17);
            *(undefined1 (*) [16])((long)pdVar1 + uVar10 * 8 + lVar5 + 8) = auVar17;
            uVar10 = uVar10 + 2;
          } while ((long)uVar10 < lVar15);
        }
        if (lVar15 < (long)uVar14) {
          uVar14 = uVar2 + uVar6 + 1;
          lVar15 = (local_38 + 1) * local_68;
          do {
            *(double *)((long)pdVar1 + uVar14 * 8 + lVar15) =
                 *(double *)((long)pdVar1 + uVar14 * 8 + lVar15) / (double)pdVar18;
            uVar14 = uVar14 + 1;
          } while (uVar7 != uVar14);
        }
      }
    }
    cols = cols + 1;
    lVar9 = lVar9 + 1;
    lVar12 = lVar12 + 8;
    lVar8 = lVar8 + 8;
    uVar7 = uVar7 - 1;
    local_50 = uVar3;
    if (__x <= 0.0) {
      return uVar3;
    }
  }
  __function = 
  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001136bb:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/Block.h"
                ,0x93,__function);
}

Assistant:

static Index unblocked(MatrixType& mat)
  {
    using std::sqrt;

    eigen_assert(mat.rows()==mat.cols());
    const Index size = mat.rows();
    for(Index k = 0; k < size; ++k)
    {
      Index rs = size-k-1; // remaining size

      Block<MatrixType,Dynamic,1> A21(mat,k+1,k,rs,1);
      Block<MatrixType,1,Dynamic> A10(mat,k,0,1,k);
      Block<MatrixType,Dynamic,Dynamic> A20(mat,k+1,0,rs,k);

      RealScalar x = numext::real(mat.coeff(k,k));
      if (k>0) x -= A10.squaredNorm();
      if (x<=RealScalar(0))
        return k;
      mat.coeffRef(k,k) = x = sqrt(x);
      if (k>0 && rs>0) A21.noalias() -= A20 * A10.adjoint();
      if (rs>0) A21 /= x;
    }
    return -1;
  }